

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

Action * __thiscall EOPlus::Parser::ParseAction(Action *__return_storage_ptr__,Parser *this)

{
  Expression local_d0;
  
  Action::Action(__return_storage_ptr__);
  __return_storage_ptr__->cond = None;
  ParseExpression(&local_d0,this);
  Expression::operator=(&__return_storage_ptr__->expr,&local_d0);
  Expression::~Expression(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

Action Parser::ParseAction()
	{
		Action action;
		action.cond = Action::None;
		action.expr = this->ParseExpression();
		return action;
	}